

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O2

void icu_63::uspoof_loadDefaultData(UErrorCode *status)

{
  UDataMemory *udm;
  SpoofData *this;
  char *p;
  
  p = "cfu";
  udm = udata_openChoice_63((char *)0x0,"cfu","confusables",spoofDataIsAcceptable,(void *)0x0,status
                           );
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this = (SpoofData *)UMemory::operator_new((UMemory *)0x38,(size_t)p);
    if (this == (SpoofData *)0x0) {
      gDefaultSpoofData = this;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return;
      }
    }
    else {
      SpoofData::SpoofData(this,udm,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        gDefaultSpoofData = this;
        ucln_i18n_registerCleanup_63(UCLN_I18N_SPOOFDATA,uspoof_cleanupDefaultData);
        return;
      }
      gDefaultSpoofData = this;
      SpoofData::~SpoofData(this);
      p = (char *)udm;
    }
    UMemory::operator_delete((UMemory *)this,p);
    gDefaultSpoofData = (SpoofData *)0x0;
  }
  return;
}

Assistant:

static void U_CALLCONV uspoof_loadDefaultData(UErrorCode& status) {
    UDataMemory *udm = udata_openChoice(nullptr, "cfu", "confusables",
                                        spoofDataIsAcceptable, 
                                        nullptr,       // context, would receive dataVersion if supplied.
                                        &status);
    if (U_FAILURE(status)) { return; }
    gDefaultSpoofData = new SpoofData(udm, status);
    if (U_FAILURE(status)) {
        delete gDefaultSpoofData;
        gDefaultSpoofData = nullptr;
        return;
    }
    if (gDefaultSpoofData == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    ucln_i18n_registerCleanup(UCLN_I18N_SPOOFDATA, uspoof_cleanupDefaultData);
}